

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall cfd::core::TaprootScriptTree::AddBranch(TaprootScriptTree *this,TapBranch *branch)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  TapBranch::AddBranch(&this->super_TapBranch,branch);
  TapBranch::GetCurrentBranchHash((ByteData256 *)&local_30,branch);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&this->nodes_,(ByteData256 *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void TaprootScriptTree::AddBranch(const TapBranch& branch) {
  TapBranch::AddBranch(branch);
  nodes_.emplace_back(branch.GetCurrentBranchHash());
}